

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ByteData *
cfd::core::ConfidentialTransaction::GetBitcoinTransaction
          (ByteData *__return_storage_ptr__,ByteData *bitcoin_tx_data,bool is_remove_witness)

{
  CfdException *pCVar1;
  bool bVar2;
  int ret;
  allocator local_91;
  wally_tx *tx_pointer;
  undefined1 local_88 [32];
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  size_t vsize;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
                     bitcoin_tx_data);
  tx_pointer = (wally_tx *)0x0;
  ret = wally_tx_from_bytes(local_40._M_impl.super__Vector_impl_data._M_start,
                            (long)local_40._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_40._M_impl.super__Vector_impl_data._M_start,0);
  if (ret != 0) {
    local_88._0_8_ = "cfdcore_elements_transaction.cpp";
    local_88._8_4_ = 0xe9b;
    local_88._16_8_ = "GetBitcoinTransaction";
    logger::warn<int&>((CfdSourceLocation *)local_88,"wally_tx_from_bytes NG[{}] ",&ret);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_88,"transaction data invalid.",(allocator *)&buffer);
    CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_88);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(__return_storage_ptr__);
  size = 0;
  vsize = 0;
  ret = wally_tx_get_length(tx_pointer,!is_remove_witness);
  if (ret != 0) {
    local_88._0_8_ = "cfdcore_elements_transaction.cpp";
    local_88._8_4_ = 0xea6;
    local_88._16_8_ = "GetBitcoinTransaction";
    logger::warn<int&>((CfdSourceLocation *)local_88,"wally_tx_get_length NG[{}].",&ret);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_88,"bitcoin tx convert error.",(allocator *)&buffer);
    CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_88);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (is_remove_witness) {
    bVar2 = false;
  }
  else {
    ret = wally_tx_get_vsize(tx_pointer,&vsize);
    if (ret != 0) {
      local_88._0_8_ = "cfdcore_elements_transaction.cpp";
      local_88._8_4_ = 0xeac;
      local_88._16_8_ = "GetBitcoinTransaction";
      logger::warn<int&>((CfdSourceLocation *)local_88,"wally_tx_get_vsize NG[{}].",&ret);
      pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_88,"bitcoin tx convert error.",(allocator *)&buffer);
      CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_88);
      __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
    }
    bVar2 = size != vsize;
  }
  ret = 0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buffer,size,
             (allocator_type *)local_88);
  ret = wally_tx_to_bytes(tx_pointer,bVar2,
                          buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)buffer.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)buffer.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,&size);
  if (ret == 0) {
    if ((long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != size) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buffer,size);
    }
    ByteData::ByteData((ByteData *)local_88,&buffer);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
    wally_tx_free(tx_pointer);
    tx_pointer = (wally_tx *)0x0;
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
    return __return_storage_ptr__;
  }
  local_88._0_8_ = "cfdcore_elements_transaction.cpp";
  local_88._8_4_ = 0xeb7;
  local_88._16_8_ = "GetBitcoinTransaction";
  logger::warn<int&>((CfdSourceLocation *)local_88,"wally_tx_to_bytes NG[{}].",&ret);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_88,"bitcoin tx convert error.",&local_91);
  CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_88);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData ConfidentialTransaction::GetBitcoinTransaction(
    const ByteData &bitcoin_tx_data, bool is_remove_witness) {
  const std::vector<uint8_t> &byte_data = bitcoin_tx_data.GetBytes();
  struct wally_tx *tx_pointer = NULL;
  int ret =
      wally_tx_from_bytes(byte_data.data(), byte_data.size(), 0, &tx_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_bytes NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }

  ByteData result;
  try {
    uint32_t flag = (is_remove_witness) ? 0 : WALLY_TX_FLAG_USE_WITNESS;
    size_t size = 0;
    size_t vsize = 0;
    ret = wally_tx_get_length(tx_pointer, flag, &size);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_tx_get_length NG[{}].", ret);
      throw CfdException(kCfdIllegalStateError, "bitcoin tx convert error.");
    }
    if (flag != 0) {
      ret = wally_tx_get_vsize(tx_pointer, &vsize);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_tx_get_vsize NG[{}].", ret);
        throw CfdException(kCfdIllegalStateError, "bitcoin tx convert error.");
      }
      if (size == vsize) {
        flag = 0;
      }
    }
    std::vector<uint8_t> buffer(size);
    ret = wally_tx_to_bytes(
        tx_pointer, flag, buffer.data(), buffer.size(), &size);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
      throw CfdException(kCfdIllegalStateError, "bitcoin tx convert error.");
    }
    if (buffer.size() != size) {
      buffer.resize(size);
    }
    result = ByteData(buffer);
    wally_tx_free(tx_pointer);
    tx_pointer = nullptr;
  } catch (const CfdException &cfd_except) {
    wally_tx_free(tx_pointer);
    throw cfd_except;
  } catch (...) {
    wally_tx_free(tx_pointer);
    warn(CFD_LOG_SOURCE, "unknown exception.");
    throw CfdException(kCfdIllegalStateError, "bitcoin tx convert error.");
  }
  return result;
}